

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall Fl_Text_Buffer::highlight(Fl_Text_Buffer *this,int start,int end)

{
  int iVar1;
  Fl_Text_Selection oldSelection;
  Fl_Text_Selection local_10;
  
  local_10.mSelected = (this->mHighlight).mSelected;
  local_10._9_3_ = *(undefined3 *)&(this->mHighlight).field_0x9;
  local_10.mStart = (this->mHighlight).mStart;
  local_10.mEnd = (this->mHighlight).mEnd;
  (this->mHighlight).mSelected = start != end;
  iVar1 = end;
  if (start < end) {
    iVar1 = start;
  }
  (this->mHighlight).mStart = iVar1;
  if (end < start) {
    end = start;
  }
  (this->mHighlight).mEnd = end;
  redisplay_selection(this,&local_10,&this->mHighlight);
  return;
}

Assistant:

void Fl_Text_Buffer::highlight(int start, int end)
{
  Fl_Text_Selection oldSelection = mHighlight;
  
  mHighlight.set(start, end);
  redisplay_selection(&oldSelection, &mHighlight);
}